

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_sparse_bit_array.cpp
# Opt level: O1

sparse_bit_array * __thiscall
crnlib::sparse_bit_array::operator&=(sparse_bit_array *this,sparse_bit_array *other)

{
  uint32 *p;
  uint32 *puVar1;
  uint j;
  long lVar2;
  uint32 oc;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  if (this != other) {
    if (other->m_num_groups != this->m_num_groups) {
      crnlib_assert("other.m_num_groups == m_num_groups",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_sparse_bit_array.cpp"
                    ,0x172);
    }
    if (this->m_num_groups != 0) {
      uVar5 = 0;
      do {
        p = this->m_ppGroups[uVar5];
        if (p != (uint32 *)0x0) {
          puVar1 = other->m_ppGroups[uVar5];
          if (puVar1 != (uint32 *)0x0) {
            lVar2 = 0;
            uVar3 = 0;
            do {
              uVar4 = puVar1[lVar2] & p[lVar2];
              p[lVar2] = uVar4;
              uVar3 = uVar3 | uVar4;
              lVar2 = lVar2 + 1;
            } while (lVar2 != 0x10);
            if (uVar3 != 0) goto LAB_0014628b;
          }
          crnlib_free(p);
          this->m_ppGroups[uVar5] = (uint32 *)0x0;
        }
LAB_0014628b:
        uVar5 = uVar5 + 1;
      } while (uVar5 < this->m_num_groups);
    }
  }
  return this;
}

Assistant:

sparse_bit_array& sparse_bit_array::operator&=(const sparse_bit_array& other)
    {
        if (this == &other)
        {
            return *this;
        }

        CRNLIB_VERIFY(other.m_num_groups == m_num_groups);

        for (uint i = 0; i < m_num_groups; i++)
        {
            uint32* d = m_ppGroups[i];
            if (!d)
            {
                continue;
            }
            uint32* s = other.m_ppGroups[i];

            if (!s)
            {
                free_group(d);
                m_ppGroups[i] = nullptr;
            }
            else
            {
                uint32 oc = 0;
                for (uint j = 0; j < cDWORDsPerGroup; j++)
                {
                    uint32 c = d[j] & s[j];
                    d[j] = c;
                    oc |= c;
                }
                if (!oc)
                {
                    free_group(d);
                    m_ppGroups[i] = nullptr;
                }
            }
        }

        return *this;
    }